

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_io_readWholeFileNamedAsByteArray(sysbvm_context_t *context,sysbvm_tuple_t filename)

{
  char *__filename;
  FILE *__stream;
  sysbvm_tuple_t size;
  sysbvm_tuple_t sVar1;
  size_t sVar2;
  
  __filename = sysbvm_tuple_bytesToCString(filename);
  __stream = fopen(__filename,"rb");
  if (__stream == (FILE *)0x0) {
    sVar1 = 0;
  }
  else {
    sysbvm_tuple_bytesToCStringFree(__filename);
    fseek(__stream,0,2);
    size = ftell(__stream);
    fseek(__stream,0,0);
    sVar1 = sysbvm_byteArray_create(context,size);
    if (size != 0 && sVar1 != 0) {
      sVar2 = fread((void *)(sVar1 + 0x10),size,1,__stream);
      if (sVar2 != 1) {
        sVar1 = 0;
      }
    }
    fclose(__stream);
  }
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_io_readWholeFileNamedAsByteArray(sysbvm_context_t *context, sysbvm_tuple_t filename)
{
    char *inputFileName = sysbvm_tuple_bytesToCString(filename);
#ifdef _WIN32
    FILE *inputFile = NULL;
    if(fopen_s(&inputFile, inputFileName, "rb"))
        return SYSBVM_NULL_TUPLE;
#else
    FILE *inputFile = fopen(inputFileName, "rb");
#endif
    if(!inputFile)
        return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_bytesToCStringFree(inputFileName);

    fseek(inputFile, 0, SEEK_END);
    size_t fileSize = ftell(inputFile);
    fseek(inputFile, 0, SEEK_SET);

    sysbvm_tuple_t readByteArray = sysbvm_byteArray_create(context, fileSize);
    if(readByteArray && fileSize > 0)
    {
        if(fread(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(readByteArray)->bytes, fileSize, 1, inputFile) != 1)
            readByteArray = SYSBVM_NULL_TUPLE;
    }

    fclose(inputFile);

    return readByteArray;
}